

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O3

ssize_t __thiscall
udpdiscovery::impl::PeerEnv::send(PeerEnv *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  uint uVar2;
  pointer pcVar3;
  bool bVar4;
  undefined1 *extraout_RAX;
  undefined1 *puVar5;
  undefined4 in_register_00000084;
  sockaddr_in addr;
  string user_data;
  string packet_data;
  Packet packet;
  sockaddr local_a8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  string local_78;
  undefined1 local_58 [24];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (__fd == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
    local_98[0] = local_88;
    pcVar3 = (this->user_data_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar3,pcVar3 + (this->user_data_)._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  }
  else {
    local_98[0] = local_88;
    pcVar3 = (this->user_data_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar3,pcVar3 + (this->user_data_)._M_string_length,__n,
               CONCAT44(in_register_00000084,__flags));
  }
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_58._4_4_ = (this->parameters_).application_id_;
  local_58._8_4_ = this->peer_id_;
  local_58._16_8_ = this->packet_index_;
  local_58[0] = (uint8_t)__n;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::swap((string *)&local_40);
  this->packet_index_ = this->packet_index_ + 1;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  bVar4 = Packet::Serialize((Packet *)local_58,(ProtocolVersion)__buf,&local_78);
  if (bVar4) {
    local_a8.sa_family = 0;
    local_a8.sa_data[0] = '\0';
    local_a8.sa_data[1] = '\0';
    local_a8.sa_data[2] = '\0';
    local_a8.sa_data[3] = '\0';
    local_a8.sa_data[4] = '\0';
    local_a8.sa_data[5] = '\0';
    local_a8.sa_data[6] = '\0';
    local_a8.sa_data[7] = '\0';
    local_a8.sa_data[8] = '\0';
    local_a8.sa_data[9] = '\0';
    local_a8.sa_data[10] = '\0';
    local_a8.sa_data[0xb] = '\0';
    local_a8.sa_data[0xc] = '\0';
    local_a8.sa_data[0xd] = '\0';
    if ((this->parameters_).can_use_broadcast_ == true) {
      uVar1 = (ushort)(this->parameters_).port_;
      local_a8.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
      local_a8.sa_family = 2;
      local_a8.sa_data._2_4_ = 0xffffffff;
    }
    if ((this->parameters_).can_use_multicast_ == true) {
      uVar1 = (ushort)(this->parameters_).port_;
      local_a8.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
      local_a8.sa_family = 2;
      uVar2 = (this->parameters_).multicast_group_address_;
      local_a8.sa_data._2_4_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    sendto(this->sock_,local_78._M_dataplus._M_p,local_78._M_string_length,0,&local_a8,0x10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p);
  }
  puVar5 = local_88;
  if (local_98[0] != puVar5) {
    operator_delete(local_98[0]);
    puVar5 = extraout_RAX;
  }
  return (ssize_t)puVar5;
}

Assistant:

void send(bool under_lock, ProtocolVersion protocol_version,
            PacketType packet_type) {
    if (!under_lock) {
      lock_.Lock();
    }
    std::string user_data = user_data_;
    if (!under_lock) {
      lock_.Unlock();
    }

    Packet packet;
    packet.set_packet_type(packet_type);
    packet.set_application_id(parameters_.application_id());
    packet.set_peer_id(peer_id_);
    packet.set_snapshot_index(packet_index_);
    packet.SwapUserData(user_data);

    ++packet_index_;

    std::string packet_data;
    if (!packet.Serialize(protocol_version, packet_data)) {
      return;
    }

    sockaddr_in addr;
    memset((char*)&addr, 0, sizeof(sockaddr_in));

    if (parameters_.can_use_broadcast()) {
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(INADDR_BROADCAST);
    }

    if (parameters_.can_use_multicast()) {
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(parameters_.multicast_group_address());
    }

    sendto(sock_, packet_data.data(), packet_data.size(), 0,
           (struct sockaddr*)&addr, sizeof(sockaddr_in));
  }